

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O0

void __thiscall
soplex::SPxGeometSC<double>::scale(SPxGeometSC<double> *this,SPxLPBase<double> *lp,bool persistent)

{
  bool bVar1;
  bool bVar2;
  Verbosity VVar3;
  element_type *this_00;
  SPxOut *_spxout;
  byte in_DL;
  SPxLPBase<double> *in_RSI;
  long *in_RDI;
  Real RVar4;
  Verbosity old_verbosity_7;
  Verbosity old_verbosity_6;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int count;
  double p1prev;
  double p0prev;
  double p1;
  double p0;
  vector<double,_std::allocator<double>_> colscale;
  vector<double,_std::allocator<double>_> rowscale;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  bool geoscale;
  Verbosity old_verbosity_1;
  double p1start;
  double p0start;
  bool colFirst;
  double epsilon;
  double rowratio;
  double colratio;
  Verbosity old_verbosity;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  SPxOut *in_stack_fffffffffffffd00;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffd08;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffd10;
  DataArray<int> *in_stack_fffffffffffffd18;
  SPxScaler<double> *in_stack_fffffffffffffd20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd28;
  SPxLPBase<double> *in_stack_fffffffffffffd30;
  double in_stack_fffffffffffffd58;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd60;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd68;
  SVSetBase<double> *in_stack_fffffffffffffd70;
  bool local_211;
  undefined4 local_160;
  Verbosity local_15c [3];
  undefined8 local_150;
  double *local_148;
  double *local_140;
  undefined8 local_138;
  double *local_130;
  double *local_128;
  long local_120;
  long local_118;
  undefined4 local_10c;
  Verbosity local_108 [3];
  int local_fc;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined8 local_d0;
  undefined8 local_a8;
  undefined4 local_84;
  Verbosity local_80 [3];
  bool local_71;
  undefined4 local_70;
  Verbosity local_6c;
  double local_68;
  double local_60;
  byte local_55;
  Real local_38;
  double local_30;
  double local_28;
  undefined4 local_1c;
  Verbosity local_18;
  byte local_11;
  SPxLPBase<double> *local_10;
  
  local_11 = in_DL & 1;
  local_10 = in_RSI;
  if ((in_RDI[5] != 0) && (VVar3 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 2 < (int)VVar3)) {
    local_18 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_1c = 3;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_1c);
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_18);
  }
  (**(code **)*in_RDI)(in_RDI,local_10);
  local_28 = (double)(**(code **)(*in_RDI + 0x198))(in_RDI,local_10);
  local_30 = (double)(**(code **)(*in_RDI + 0x1a0))(in_RDI,local_10);
  SPxScaler<double>::tolerances
            ((SPxScaler<double> *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x29c5b7);
  RVar4 = Tolerances::epsilon(this_00);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x29c5d7);
  local_55 = local_28 < local_30;
  if ((bool)local_55) {
    local_60 = local_28;
    local_68 = local_30;
  }
  else {
    local_60 = local_30;
    local_68 = local_28;
  }
  local_38 = RVar4;
  if ((in_RDI[5] != 0) && (VVar3 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar3)) {
    local_6c = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
    local_70 = 4;
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_70);
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    (*(local_10->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(local_10,1);
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    (*(local_10->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(local_10,1);
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    soplex::operator<<(in_stack_fffffffffffffd00,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_6c);
  }
  bVar1 = local_68 != (double)in_RDI[10];
  bVar2 = (double)in_RDI[10] <= local_68;
  local_71 = bVar2 && bVar1;
  if (!bVar2 || !bVar1) {
    if ((in_RDI[5] != 0) && (VVar3 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar3)) {
      local_80[2] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_80[1] = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_80 + 1);
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_80 + 2);
    }
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      SPxLPBase<double>::setScalingInfo(local_10,true);
      return;
    }
    if ((in_RDI[5] != 0) && (VVar3 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar3)) {
      local_80[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_84 = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_84);
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_80);
    }
  }
  SPxLPBase<double>::nRows((SPxLPBase<double> *)0x29c9b6);
  local_a8 = 0x3ff0000000000000;
  std::allocator<double>::allocator((allocator<double> *)0x29c9e7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20,
             (size_type)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10._M_current,
             (allocator_type *)in_stack_fffffffffffffd08._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x29ca1b);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x29ca28);
  local_d0 = 0x3ff0000000000000;
  std::allocator<double>::allocator((allocator<double> *)0x29ca69);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20,
             (size_type)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10._M_current,
             (allocator_type *)in_stack_fffffffffffffd08._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x29ca9d);
  local_e0 = 0.0;
  local_e8 = 0.0;
  if ((local_71 & 1U) != 0) {
    local_f0 = local_60;
    local_f8 = local_68;
    for (local_fc = 0; local_fc < *(int *)((long)in_RDI + 0x44); local_fc = local_fc + 1) {
      if ((local_55 & 1) == 0) {
        LPRowSetBase<double>::rowSet(&local_10->super_LPRowSetBase<double>);
        local_e0 = computeScalingVec<double>
                             (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                              in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        LPColSetBase<double>::colSet(&local_10->super_LPColSetBase<double>);
        local_e8 = computeScalingVec<double>
                             (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                              in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      }
      else {
        LPColSetBase<double>::colSet(&local_10->super_LPColSetBase<double>);
        local_e0 = computeScalingVec<double>
                             (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                              in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
        LPRowSetBase<double>::rowSet(&local_10->super_LPRowSetBase<double>);
        local_e8 = computeScalingVec<double>
                             (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                              in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      }
      if ((in_RDI[5] != 0) && (VVar3 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar3)) {
        local_108[2] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
        local_108[1] = 5;
        (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_108 + 1);
        soplex::operator<<(in_stack_fffffffffffffd00,
                           (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        soplex::operator<<(in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
        soplex::operator<<(in_stack_fffffffffffffd00,
                           (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        soplex::operator<<(in_stack_fffffffffffffd00,
                           (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        soplex::operator<<(in_stack_fffffffffffffd00,
                           (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        soplex::operator<<(in_stack_fffffffffffffd00,
                           (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        soplex::operator<<(in_stack_fffffffffffffd00,
                           (_func_ostream_ptr_ostream_ptr *)
                           CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_108 + 2);
      }
      if (((double)in_RDI[9] * local_f0 < local_e0) && ((double)in_RDI[9] * local_f8 < local_e8))
      break;
      local_f0 = local_e0;
      local_f8 = local_e8;
    }
    local_211 = true;
    if ((double)in_RDI[9] * local_60 < local_e0) {
      local_211 = local_e8 <= (double)in_RDI[9] * local_68;
    }
    local_71 = local_211;
  }
  if (((local_71 & 1U) == 0) && ((*(byte *)(in_RDI + 8) & 1) == 0)) {
    if ((in_RDI[5] != 0) && (VVar3 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar3)) {
      local_108[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_10c = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_10c);
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_108);
    }
    SPxLPBase<double>::setScalingInfo(local_10,true);
  }
  else {
    local_118 = in_RDI[2];
    local_120 = in_RDI[3];
    if ((*(byte *)(in_RDI + 8) & 1) == 0) {
      SPxScaler<double>::computeExpVec
                (in_stack_fffffffffffffd20,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd18,
                 (DataArray<int> *)in_stack_fffffffffffffd10._M_current);
      SPxScaler<double>::computeExpVec
                (in_stack_fffffffffffffd20,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd18,
                 (DataArray<int> *)in_stack_fffffffffffffd10._M_current);
    }
    else {
      if ((local_71 & 1U) == 0) {
        local_128 = (double *)
                    std::vector<double,_std::allocator<double>_>::begin
                              ((vector<double,_std::allocator<double>_> *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_130 = (double *)
                    std::vector<double,_std::allocator<double>_>::end
                              ((vector<double,_std::allocator<double>_> *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_138 = 0x3ff0000000000000;
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                   (double *)in_stack_fffffffffffffd00);
        local_140 = (double *)
                    std::vector<double,_std::allocator<double>_>::begin
                              ((vector<double,_std::allocator<double>_> *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_148 = (double *)
                    std::vector<double,_std::allocator<double>_>::end
                              ((vector<double,_std::allocator<double>_> *)
                               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_150 = 0x3ff0000000000000;
        std::
        fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                  (in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,
                   (double *)in_stack_fffffffffffffd00);
      }
      SPxEquiliSC<double>::computePostequiExpVecs
                (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd20,
                 in_stack_fffffffffffffd18,(DataArray<int> *)in_stack_fffffffffffffd10._M_current,
                 (double)in_stack_fffffffffffffd08._M_current);
    }
    (**(code **)(*in_RDI + 0x10))(in_RDI,local_10);
    if ((in_RDI[5] != 0) && (VVar3 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 4 < (int)VVar3)) {
      local_15c[2] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_15c[1] = 5;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_15c + 1);
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*in_RDI + 0x188))();
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*in_RDI + 400))();
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*in_RDI + 0x178))();
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*in_RDI + 0x180))();
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (_func_ostream_ptr_ostream_ptr *)
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_15c + 2);
    }
    if ((in_RDI[5] != 0) && (VVar3 = SPxOut::getVerbosity((SPxOut *)in_RDI[5]), 3 < (int)VVar3)) {
      local_15c[0] = SPxOut::getVerbosity((SPxOut *)in_RDI[5]);
      local_160 = 4;
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],&local_160);
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (*(local_10->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(local_10,0);
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (*(local_10->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(local_10,0);
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*in_RDI + 0x198))(in_RDI,local_10);
      soplex::operator<<(in_stack_fffffffffffffd00,
                         (double)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      in_stack_fffffffffffffd10._M_current =
           (double *)
           soplex::operator<<(in_stack_fffffffffffffd00,
                              (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8))
      ;
      (**(code **)(*in_RDI + 0x1a0))(in_RDI,local_10);
      _spxout = soplex::operator<<(in_stack_fffffffffffffd00,
                                   (double)CONCAT44(in_stack_fffffffffffffcfc,
                                                    in_stack_fffffffffffffcf8));
      soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      (**(code **)(*(long *)in_RDI[5] + 0x10))((long *)in_RDI[5],local_15c);
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffd10._M_current);
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}